

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall ContextField::saveXml(ContextField *this,ostream *s)

{
  ostream *poVar1;
  void *this_00;
  ostream *s_local;
  ContextField *this_local;
  
  std::operator<<(s,"<contextfield");
  std::operator<<(s," signbit=\"");
  if ((this->signbit & 1U) == 0) {
    std::operator<<(s,"false\"");
  }
  else {
    std::operator<<(s,"true\"");
  }
  poVar1 = std::operator<<(s," startbit=\"");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,this->startbit);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," endbit=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->endbit);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," startbyte=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->startbyte);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," endbyte=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->endbyte);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," shift=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->shift);
  std::operator<<(poVar1,"\"/>\n");
  return;
}

Assistant:

void ContextField::saveXml(ostream &s) const

{
  s << "<contextfield";
  s << " signbit=\"";
  if (signbit)
    s << "true\"";
  else
    s << "false\"";
  s << " startbit=\"" << dec << startbit << "\"";
  s << " endbit=\"" << endbit << "\"";
  s << " startbyte=\"" << startbyte << "\"";
  s << " endbyte=\"" << endbyte << "\"";
  s << " shift=\"" << shift << "\"/>\n";
}